

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PendingListAppend
              (PendingList **pp,sqlite3_int64 iDocid,sqlite3_int64 iCol,sqlite3_int64 iPos,int *pRc)

{
  long lVar1;
  int *piVar2;
  int *piVar3;
  undefined8 in_RCX;
  long in_RDX;
  PendingList **in_RSI;
  undefined8 *in_RDI;
  int *in_R8;
  long in_FS_OFFSET;
  u64 iDelta;
  int rc;
  PendingList *p;
  sqlite3_int64 in_stack_ffffffffffffffa0;
  PendingList **in_stack_ffffffffffffffa8;
  int local_44;
  uint local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = (int *)*in_RDI;
  local_44 = 0;
  if ((piVar2 == (int *)0x0) || (*(PendingList ***)(piVar2 + 6) != in_RSI)) {
    if (piVar2 == (int *)0x0) {
      in_stack_ffffffffffffffa0 = 0;
    }
    else {
      in_stack_ffffffffffffffa0 = *(sqlite3_int64 *)(piVar2 + 6);
      *piVar2 = *piVar2 + 1;
    }
    in_stack_ffffffffffffffa8 = in_RSI;
    local_44 = fts3PendingListAppendVarint(in_RSI,in_stack_ffffffffffffffa0);
    if (local_44 != 0) goto LAB_00252ac1;
    piVar2[8] = -1;
    piVar2[9] = -1;
    piVar2[10] = 0;
    piVar2[0xb] = 0;
    *(PendingList ***)(piVar2 + 6) = in_RSI;
  }
  if ((0 < in_RDX) && (*(long *)(piVar2 + 8) != in_RDX)) {
    local_44 = fts3PendingListAppendVarint(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    if ((local_44 != 0) ||
       (local_44 = fts3PendingListAppendVarint(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0),
       local_44 != 0)) goto LAB_00252ac1;
    *(long *)(piVar2 + 8) = in_RDX;
    piVar2[10] = 0;
    piVar2[0xb] = 0;
  }
  if ((-1 < in_RDX) &&
     (local_44 = fts3PendingListAppendVarint(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0),
     local_44 == 0)) {
    *(undefined8 *)(piVar2 + 10) = in_RCX;
  }
LAB_00252ac1:
  *in_R8 = local_44;
  piVar3 = (int *)*in_RDI;
  if (piVar2 != piVar3) {
    *in_RDI = piVar2;
  }
  local_14 = (uint)(piVar2 != piVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3PendingListAppend(
  PendingList **pp,               /* IN/OUT: PendingList structure */
  sqlite3_int64 iDocid,           /* Docid for entry to add */
  sqlite3_int64 iCol,             /* Column for entry to add */
  sqlite3_int64 iPos,             /* Position of term for entry to add */
  int *pRc                        /* OUT: Return code */
){
  PendingList *p = *pp;
  int rc = SQLITE_OK;

  assert( !p || p->iLastDocid<=iDocid );

  if( !p || p->iLastDocid!=iDocid ){
    u64 iDelta = (u64)iDocid - (u64)(p ? p->iLastDocid : 0);
    if( p ){
      assert( p->nData<p->nSpace );
      assert( p->aData[p->nData]==0 );
      p->nData++;
    }
    if( SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, iDelta)) ){
      goto pendinglistappend_out;
    }
    p->iLastCol = -1;
    p->iLastPos = 0;
    p->iLastDocid = iDocid;
  }
  if( iCol>0 && p->iLastCol!=iCol ){
    if( SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, 1))
     || SQLITE_OK!=(rc = fts3PendingListAppendVarint(&p, iCol))
    ){
      goto pendinglistappend_out;
    }
    p->iLastCol = iCol;
    p->iLastPos = 0;
  }
  if( iCol>=0 ){
    assert( iPos>p->iLastPos || (iPos==0 && p->iLastPos==0) );
    rc = fts3PendingListAppendVarint(&p, 2+iPos-p->iLastPos);
    if( rc==SQLITE_OK ){
      p->iLastPos = iPos;
    }
  }

 pendinglistappend_out:
  *pRc = rc;
  if( p!=*pp ){
    *pp = p;
    return 1;
  }
  return 0;
}